

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_api.hpp
# Opt level: O3

DataBlobSourceDescription * __thiscall
hrgls::datablob::DataBlobSource::GetInfo
          (DataBlobSourceDescription *__return_storage_ptr__,DataBlobSource *this)

{
  hrgls_DataBlobSource phVar1;
  DataBlobSource_private *pDVar2;
  int iVar3;
  char *pcVar4;
  mapped_type *pmVar5;
  char *name;
  hrgls_APIDataBlobSourceInfo info;
  DataBlobSourceDescription ret;
  key_type local_88;
  key_type local_80;
  undefined8 local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_68 = 0;
  local_60[0] = 0;
  local_70 = local_60;
  if ((this->m_private == (DataBlobSource_private *)0x0) ||
     (phVar1 = this->m_private->m_stream, phVar1 == (hrgls_DataBlobSource)0x0)) {
LAB_00105172:
    (__return_storage_ptr__->m_name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_name).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_70,local_70 + local_68);
  }
  else {
    iVar3 = hrgls_DataBlobSourceGetInfo(phVar1,&local_78);
    pDVar2 = this->m_private;
    pcVar4 = (char *)pthread_self();
    local_88._M_thread = (native_handle_type)pcVar4;
    pmVar5 = std::
             map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
             ::operator[](&pDVar2->m_status,&local_88);
    *pmVar5 = iVar3;
    if (iVar3 == 0) {
      iVar3 = hrgls_APIDataBlobSourceGetName(local_78,&local_88);
      local_80._M_thread = (native_handle_type)pcVar4;
      pmVar5 = std::
               map<std::thread::id,_int,_std::less<std::thread::id>,_std::allocator<std::pair<const_std::thread::id,_int>_>_>
               ::operator[](&this->m_private->m_status,&local_80);
      *pmVar5 = iVar3;
      if (iVar3 == 0) {
        std::__cxx11::string::string
                  ((string *)local_50,(char *)local_88._M_thread,(allocator *)&local_80);
        std::__cxx11::string::_M_assign((string *)&local_70);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        goto LAB_00105172;
      }
    }
    (__return_storage_ptr__->m_name)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_name).field_2;
    (__return_storage_ptr__->m_name)._M_string_length = 0;
    (__return_storage_ptr__->m_name).field_2._M_local_buf[0] = '\0';
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

DataBlobSourceDescription DataBlobSource::GetInfo()
    {
      DataBlobSourceDescription ret;
      if (m_private && m_private->m_stream) {

        hrgls_APIDataBlobSourceInfo info;
        if (hrgls_STATUS_OKAY !=
            (m_private->m_status[std::this_thread::get_id()] = hrgls_DataBlobSourceGetInfo(m_private->m_stream, &info))) {
          return DataBlobSourceDescription();
        }

        // Get and fill in the name.
        const char *name;
        if (hrgls_STATUS_OKAY !=
          (m_private->m_status[std::this_thread::get_id()] = hrgls_APIDataBlobSourceGetName(info, &name))) {
          return DataBlobSourceDescription();
        }
        ret.Name(name);
      }
      return ret;
    }